

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O0

void __thiscall SAT::simplifyDB(SAT *this)

{
  Clause *pCVar1;
  bool bVar2;
  uint uVar3;
  Clause **ppCVar4;
  long in_RDI;
  uint j;
  uint i;
  SAT *in_stack_00000028;
  Clause *in_stack_00000038;
  SAT *in_stack_00000040;
  undefined4 local_10;
  undefined4 local_c;
  
  local_10 = 0;
  local_c = 0;
  while( true ) {
    uVar3 = vec<Clause_*>::size((vec<Clause_*> *)(in_RDI + 0x20));
    if (uVar3 <= local_c) break;
    vec<Clause_*>::operator[]((vec<Clause_*> *)(in_RDI + 0x20),local_c);
    bVar2 = simplify(in_stack_00000028,(Clause *)this);
    if (bVar2) {
      vec<Clause_*>::operator[]((vec<Clause_*> *)(in_RDI + 0x20),local_c);
      removeClause(in_stack_00000040,in_stack_00000038);
    }
    else {
      ppCVar4 = vec<Clause_*>::operator[]((vec<Clause_*> *)(in_RDI + 0x20),local_c);
      pCVar1 = *ppCVar4;
      ppCVar4 = vec<Clause_*>::operator[]((vec<Clause_*> *)(in_RDI + 0x20),local_10);
      *ppCVar4 = pCVar1;
      local_10 = local_10 + 1;
    }
    local_c = local_c + 1;
  }
  vec<Clause_*>::resize((vec<Clause_*> *)(in_RDI + 0x20),local_10);
  *(long *)(in_RDI + 0x218) =
       *(long *)(in_RDI + 0x200) + *(long *)(in_RDI + 0x220) + *(long *)(in_RDI + 0x228);
  return;
}

Assistant:

void SAT::simplifyDB() {
	unsigned int i;
	unsigned int j;
	for (i = j = 0; i < learnts.size(); i++) {
		if (simplify(*learnts[i])) {
			removeClause(*learnts[i]);
		} else {
			learnts[j++] = learnts[i];
		}
	}
	learnts.resize(j);
	next_simp_db = propagations + clauses_literals + learnts_literals;
}